

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O3

Ref __thiscall
wasm::Wasm2JSBuilder::processFunctionBody(wasm::Module*,wasm::Function*,bool)::ExpressionProcessor::
blockify(cashew::Ref_(void *this,Ref ast)

{
  char cVar1;
  Ref *this_00;
  undefined8 *puVar2;
  Value *local_28;
  Ref ret;
  
  ret.inst = (Value *)this;
  cVar1 = cashew::Ref::operator!(&ret);
  if ((cVar1 == '\0') && ((ret.inst)->type == Array)) {
    this_00 = (Ref *)cashew::Ref::operator[]((uint)&ret);
    cVar1 = cashew::Ref::operator==(this_00,(IString *)&BLOCK);
    if (cVar1 != '\0') {
      return (Ref)(Value *)this;
    }
  }
  local_28 = (Value *)cashew::ValueBuilder::makeBlock();
  puVar2 = (undefined8 *)cashew::Ref::operator[]((uint)&local_28);
  cashew::Value::push_back((Value *)*puVar2,(Ref)this);
  return (Ref)local_28;
}

Assistant:

Ref blockify(Ref ast) {
      if (isBlock(ast)) {
        return ast;
      }
      Ref ret = ValueBuilder::makeBlock();
      ret[1]->push_back(ValueBuilder::makeStatement(ast));
      return ret;
    }